

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O0

void __thiscall serialization::xml_iarchive::load<int>(xml_iarchive *this,int *v)

{
  byte bVar1;
  reference ppxVar2;
  char *pcVar3;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  int *local_18;
  int *v_local;
  xml_iarchive *this_local;
  
  local_18 = v;
  v_local = (int *)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  ppxVar2 = std::
            stack<const_rapidxml::xml_node<char>_*,_std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>_>
            ::top(&this->stack_);
  pcVar3 = rapidxml::xml_base<char>::value(&(*ppxVar2)->super_xml_base<char>);
  std::operator<<(local_190,pcVar3);
  std::istream::operator>>((istream *)local_1a0,local_18);
  bVar1 = std::ios::eof();
  if ((bVar1 & 1) == 0) {
    throw_serialization_error("load ","xml");
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void load(T & v) const
    {
        std::stringstream ss;
        ss << stack_.top()->value();
        ss >> v;
        if(!ss.eof())
        {
            throw_serialization_error("load ", "xml");
        }
    }